

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O0

UTrie2 * utrie2_clone_63(UTrie2 *other,UErrorCode *pErrorCode)

{
  UBool UVar1;
  void *pvVar2;
  UNewTrie2 *pUVar3;
  UTrie2 *local_28;
  UTrie2 *trie;
  UErrorCode *pErrorCode_local;
  UTrie2 *other_local;
  
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if ((other == (UTrie2 *)0x0) ||
       ((other->memory == (void *)0x0 && (other->newTrie == (UNewTrie2 *)0x0)))) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      other_local = (UTrie2 *)0x0;
    }
    else {
      local_28 = (UTrie2 *)uprv_malloc_63(0x50);
      if (local_28 == (UTrie2 *)0x0) {
        other_local = (UTrie2 *)0x0;
      }
      else {
        memcpy(local_28,other,0x50);
        if (other->memory == (void *)0x0) {
          pUVar3 = cloneBuilder(other->newTrie);
          local_28->newTrie = pUVar3;
        }
        else {
          pvVar2 = uprv_malloc_63((long)other->length);
          local_28->memory = pvVar2;
          if (local_28->memory != (void *)0x0) {
            local_28->isMemoryOwned = '\x01';
            memcpy(local_28->memory,other->memory,(long)other->length);
            local_28->index =
                 (uint16_t *)
                 ((long)local_28->memory + ((long)other->index - (long)other->memory >> 1) * 2);
            if (other->data16 != (uint16_t *)0x0) {
              local_28->data16 =
                   (uint16_t *)
                   ((long)local_28->memory + ((long)other->data16 - (long)other->memory >> 1) * 2);
            }
            if (other->data32 != (uint32_t *)0x0) {
              local_28->data32 =
                   (uint32_t *)
                   ((long)local_28->memory + ((long)other->data32 - (long)other->memory >> 2) * 4);
            }
          }
        }
        if ((local_28->memory == (void *)0x0) && (local_28->newTrie == (UNewTrie2 *)0x0)) {
          uprv_free_63(local_28);
          local_28 = (UTrie2 *)0x0;
        }
        other_local = local_28;
      }
    }
  }
  else {
    other_local = (UTrie2 *)0x0;
  }
  return other_local;
}

Assistant:

U_CAPI UTrie2 * U_EXPORT2
utrie2_clone(const UTrie2 *other, UErrorCode *pErrorCode) {
    UTrie2 *trie;

    if(U_FAILURE(*pErrorCode)) {
        return NULL;
    }
    if(other==NULL || (other->memory==NULL && other->newTrie==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    trie=(UTrie2 *)uprv_malloc(sizeof(UTrie2));
    if(trie==NULL) {
        return NULL;
    }
    uprv_memcpy(trie, other, sizeof(UTrie2));

    if(other->memory!=NULL) {
        trie->memory=uprv_malloc(other->length);
        if(trie->memory!=NULL) {
            trie->isMemoryOwned=TRUE;
            uprv_memcpy(trie->memory, other->memory, other->length);

            /* make the clone's pointers point to its own memory */
            trie->index=(uint16_t *)trie->memory+(other->index-(uint16_t *)other->memory);
            if(other->data16!=NULL) {
                trie->data16=(uint16_t *)trie->memory+(other->data16-(uint16_t *)other->memory);
            }
            if(other->data32!=NULL) {
                trie->data32=(uint32_t *)trie->memory+(other->data32-(uint32_t *)other->memory);
            }
        }
    } else /* other->newTrie!=NULL */ {
        trie->newTrie=cloneBuilder(other->newTrie);
    }

    if(trie->memory==NULL && trie->newTrie==NULL) {
        uprv_free(trie);
        trie=NULL;
    }
    return trie;
}